

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::set
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  short sVar3;
  uint uVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  element_type *peVar8;
  Atom *pAVar9;
  size_type sVar10;
  const_reference __buf;
  ssize_t sVar11;
  reference pvVar12;
  shared_ptr<r_comp::RepliStruct> local_220;
  allocator local_209;
  string local_208 [32];
  shared_ptr<r_comp::RepliStruct> local_1e8;
  shared_ptr<r_comp::RepliStruct> local_1d8;
  shared_ptr<r_comp::RepliStruct> local_1c8;
  undefined1 local_1b8 [8];
  Class _p;
  byte local_159;
  ulong uStack_158;
  bool r;
  size_t i;
  Atom local_140 [6];
  uint16_t local_13a;
  uint local_138;
  Atom local_134 [2];
  uint16_t j;
  uint32_t arity;
  Atom local_12c [6];
  uint16_t uStack_126;
  uint8_t element_count;
  undefined4 local_124;
  undefined1 local_120 [2];
  uint16_t content_write_index;
  string local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [8];
  string label;
  bool lbl;
  bool write_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *node_local;
  Compiler *this_local;
  
  std::__cxx11::string::string(local_60);
  peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar5 = std::operator!=(&peVar8->label,"");
  if (bVar5) {
    peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )node);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_90,(ulong)&peVar8->label);
    std::__cxx11::string::operator=(local_60,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::string(local_b0,local_60);
    bVar5 = addLocalReference(this,(string *)local_b0,write_index,p);
    std::__cxx11::string::~string(local_b0);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      std::__cxx11::string::find((char *)local_60,0x1ca90f);
      std::__cxx11::string::substr((ulong)local_110,(ulong)local_60);
      std::operator+((char *)local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"cast to "
                    );
      std::operator+(local_d0,(char *)local_f0);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)local_120,node);
      set_error(this,local_d0,(shared_ptr<r_comp::RepliStruct> *)local_120);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)local_120);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      this_local._7_1_ = false;
      goto LAB_00199333;
    }
  }
  uStack_126 = 0;
  if (write) {
    r_code::Atom::IPointer((ushort)local_12c);
    pAVar9 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(pAVar9,local_12c);
    r_code::Atom::~Atom(local_12c);
    cVar6 = r_code::Atom::getDescriptor();
    if ((cVar6 == -0x3e) && (p->use_as != I_SET)) {
      arity._3_1_ = r_code::Atom::getAtomCount();
      pIVar2 = this->current_object;
      uVar1 = *extent_index;
      *extent_index = uVar1 + 1;
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar9,&p->atom);
    }
    else {
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      sVar10 = std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::size(&peVar8->args);
      arity._3_1_ = (byte)sVar10;
      r_code::Atom::Set((uchar)local_134);
      pIVar2 = this->current_object;
      uVar1 = *extent_index;
      *extent_index = uVar1 + 1;
      pAVar9 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar9,local_134);
      r_code::Atom::~Atom(local_134);
    }
    uStack_126 = *extent_index;
    *extent_index = *extent_index + (ushort)arity._3_1_;
  }
  local_138 = 0xffffffff;
  if (p->use_as == I_CLASS) {
    bVar7 = r_code::Atom::getAtomCount();
    local_138 = (uint)bVar7;
    if (write) {
      for (local_13a = uStack_126; (uint)local_13a < uStack_126 + local_138;
          local_13a = local_13a + 1) {
        r_code::Atom::Wildcard((ushort)local_140);
        pAVar9 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_13a);
        r_code::Atom::operator=(pAVar9,local_140);
        r_code::Atom::~Atom(local_140);
      }
    }
  }
  peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  sVar10 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::size(&peVar8->args);
  if ((sVar10 != local_138) && (local_138 != 0xffffffff)) {
    if (((this->state).no_arity_check & 1U) == 0) {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr((shared_ptr<r_comp::RepliStruct> *)&i,node);
      uVar4 = local_138;
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      sVar10 = std::
               vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ::size(&peVar8->args);
      set_arity_error(this,(shared_ptr<r_comp::RepliStruct> *)&i,(uint16_t)uVar4,(uint16_t)sVar10);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)&i);
      this_local._7_1_ = false;
      goto LAB_00199333;
    }
    (this->state).no_arity_check = false;
  }
  uStack_158 = 0;
  while( true ) {
    peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    sVar10 = std::
             vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ::size(&peVar8->args);
    if (sVar10 <= uStack_158) break;
    sVar3 = (short)uStack_158;
    switch(p->use_as) {
    case I_CLASS:
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      pvVar12 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::operator[](&peVar8->args,uStack_158);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1d8,pvVar12);
      __buf = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              operator[](&p->things_to_read,uStack_158);
      sVar11 = read(this,(int)&local_1d8,__buf,1);
      local_159 = (byte)sVar11 & 1;
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1d8);
      break;
    case I_EXPRESSION:
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      pvVar12 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::operator[](&peVar8->args,uStack_158);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                ((shared_ptr<r_comp::RepliStruct> *)&_p.type,pvVar12);
      local_159 = read_expression(this,(Ptr *)&_p.type,true,p,uStack_126 + sVar3,extent_index,write)
      ;
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)&_p.type)
      ;
      break;
    case I_SET:
      Class::Class((Class *)local_1b8,p);
      _p.things_to_read.
      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      pvVar12 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::operator[](&peVar8->args,uStack_158);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1c8,pvVar12);
      local_159 = read_set(this,&local_1c8,true,(Class *)local_1b8,uStack_126 + sVar3,extent_index,
                           write);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1c8);
      local_124 = 8;
      Class::~Class((Class *)local_1b8);
      break;
    case I_DCLASS:
      peVar8 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      pvVar12 = std::
                vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                ::operator[](&peVar8->args,uStack_158);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1e8,pvVar12);
      local_159 = read_class(this,&local_1e8,true,(Class *)0x0,uStack_126 + sVar3,extent_index,write
                            );
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1e8);
    }
    if ((local_159 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208," error: illegal element in set",&local_209);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_220,node);
      set_error(this,(string *)local_208,&local_220);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_220);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      this_local._7_1_ = false;
      goto LAB_00199333;
    }
    uStack_158 = uStack_158 + 1;
  }
  this_local._7_1_ = true;
LAB_00199333:
  local_124 = 1;
  std::__cxx11::string::~string(local_60);
  return this_local._7_1_;
}

Assistant:

bool Compiler::set(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    if (lbl) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint16_t content_write_index = 0;

    if (write) {
        current_object->code[write_index] = Atom::IPointer(extent_index);
        uint8_t element_count;

        if (p.atom.getDescriptor() == Atom::S_SET && p.use_as != StructureMember::I_SET) {
            element_count = p.atom.getAtomCount();
            current_object->code[extent_index++] = p.atom;
        } else {
            element_count = node->args.size();//set_element_count(node);
            current_object->code[extent_index++] = Atom::Set(element_count);
        }

        content_write_index = extent_index;
        extent_index += element_count;
    }

    uint32_t arity = UINT32_MAX;

    if (p.use_as == StructureMember::I_CLASS) { // undefined arity for unstructured sets.
        arity = p.atom.getAtomCount();

        if (write) // fill up with wildcards that will be overwritten up to ::.
            for (uint16_t j = content_write_index; j < content_write_index + arity; ++j) {
                current_object->code[j] = Atom::Wildcard();
            }
    }

    if (node->args.size() != arity && arity != UINT32_MAX) {
        if (state.no_arity_check) {
            state.no_arity_check = false;
        } else {
            set_arity_error(node, arity, node->args.size());
            return false;
        }
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        bool r;

        switch (p.use_as) {
        case StructureMember::I_EXPRESSION:
            r = read_expression(node->args[i], true, &p, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_SET: {
            Class _p = p;
            _p.use_as = StructureMember::I_CLASS;
            r = read_set(node->args[i], true, &_p, content_write_index + i, extent_index, write);
            break;
        }

        case StructureMember::I_CLASS:
            r = read(node->args[i], p.things_to_read[i], true, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_DCLASS:
            r = read_class(node->args[i], true, nullptr, content_write_index + i, extent_index, write);
            break;
        }

        if (!r) {
            set_error(" error: illegal element in set", node);
            return false;
        }
    }

    return true;
}